

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

RABlock * __thiscall
asmjit::v1_14::BaseRAPass::newBlockOrExistingAt
          (BaseRAPass *this,LabelNode *cbLabel,BaseNode **stoppedAt)

{
  RABlock *pRVar1;
  FuncNode *pFVar2;
  LabelNode *pLVar3;
  long lVar4;
  bool bVar5;
  
  pRVar1 = *(RABlock **)(cbLabel + 0x20);
  if (pRVar1 == (RABlock *)0x0) {
    lVar4 = 0;
    pFVar2 = (FuncNode *)cbLabel;
    while (pFVar2 = *(FuncNode **)pFVar2, pRVar1 = (RABlock *)0x0, pFVar2 != (FuncNode *)0x0) {
      if (pFVar2->field_0x10 != '\x04') {
        if (pFVar2->field_0x10 != '\x03') break;
        if (pFVar2 == this->_func) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                     ,0xf8,"node != func");
        }
        if (*(RABlock **)&pFVar2->field_0x20 != (RABlock *)0x0) {
          pRVar1 = *(RABlock **)&pFVar2->field_0x20;
          if (pFVar2 == (FuncNode *)this->_func->_exitNode) {
            pRVar1 = (RABlock *)0x0;
          }
          break;
        }
        lVar4 = lVar4 + 1;
      }
    }
    if (stoppedAt != (BaseNode **)0x0) {
      *stoppedAt = (BaseNode *)pFVar2;
    }
    if ((pRVar1 == (RABlock *)0x0) &&
       (pRVar1 = newBlock(this,(BaseNode *)0x0), pRVar1 == (RABlock *)0x0)) {
      return (RABlock *)0x0;
    }
    *(RABlock **)(cbLabel + 0x20) = pRVar1;
    pLVar3 = cbLabel;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      pLVar3 = *(LabelNode **)pLVar3;
      while (pLVar3[0x10] != (LabelNode)0x3) {
        pLVar3 = *(LabelNode **)pLVar3;
        if (pLVar3 == (LabelNode *)0x0) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                     ,0x125,"node != nullptr");
        }
      }
      *(RABlock **)(pLVar3 + 0x20) = pRVar1;
    }
    if (*(long *)(pRVar1 + 0x10) == 0) {
      *(LabelNode **)(pRVar1 + 0x10) = pLVar3;
      *(LabelNode **)(pRVar1 + 0x18) = cbLabel;
    }
  }
  return pRVar1;
}

Assistant:

RABlock* BaseRAPass::newBlockOrExistingAt(LabelNode* cbLabel, BaseNode** stoppedAt) noexcept {
  if (cbLabel->hasPassData())
    return cbLabel->passData<RABlock>();

  FuncNode* func = this->func();
  BaseNode* node = cbLabel->prev();
  RABlock* block = nullptr;

  // Try to find some label, but terminate the loop on any code. We try hard to coalesce code that contains two
  // consecutive labels or a combination of non-code nodes between 2 or more labels.
  //
  // Possible cases that would share the same basic block:
  //
  //   1. Two or more consecutive labels:
  //     Label1:
  //     Label2:
  //
  //   2. Two or more labels separated by non-code nodes:
  //     Label1:
  //     ; Some comment...
  //     .align 16
  //     Label2:
  size_t nPendingLabels = 0;

  while (node) {
    if (node->type() == NodeType::kLabel) {
      // Function has a different NodeType, just make sure this was not messed up as we must never associate
      // BasicBlock with a `func` itself.
      ASMJIT_ASSERT(node != func);

      block = node->passData<RABlock>();
      if (block) {
        // Exit node has always a block associated with it. If we went here it means that `cbLabel` passed here
        // is after the end of the function and cannot be merged with the function exit block.
        if (node == func->exitNode())
          block = nullptr;
        break;
      }

      nPendingLabels++;
    }
    else if (node->type() == NodeType::kAlign) {
      // Align node is fine.
    }
    else {
      break;
    }

    node = node->prev();
  }

  if (stoppedAt)
    *stoppedAt = node;

  if (!block) {
    block = newBlock();
    if (ASMJIT_UNLIKELY(!block))
      return nullptr;
  }

  cbLabel->setPassData<RABlock>(block);
  node = cbLabel;

  while (nPendingLabels) {
    node = node->prev();
    for (;;) {
      if (node->type() == NodeType::kLabel) {
        node->setPassData<RABlock>(block);
        nPendingLabels--;
        break;
      }

      node = node->prev();
      ASMJIT_ASSERT(node != nullptr);
    }
  }

  if (!block->first()) {
    block->setFirst(node);
    block->setLast(cbLabel);
  }

  return block;
}